

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

bool __thiscall chatra::RuntimeImp::distributeStringTable(RuntimeImp *this,uint oldVersion)

{
  __atomic_flag_data_type _Var1;
  StringTable *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  _Hash_node_base *p_Var5;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  this_00 = (this->primarySTable).
            super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((oldVersion == 0xffffffff) || (this_00->version != oldVersion)) {
    StringTable::clearDirty(this_00);
    do {
      LOCK();
      _Var1 = (this->lockSTable).flag.super___atomic_flag_base._M_i;
      (this->lockSTable).flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var1 != false);
    StringTable::copy((StringTable *)&local_28,
                      (EVP_PKEY_CTX *)
                      (this->primarySTable).
                      super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (EVP_PKEY_CTX *)CONCAT71(extraout_var,extraout_DL));
    p_Var3 = p_Stack_20;
    peVar2 = local_28;
    local_28 = (element_type *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (this->distributedSTable).
              super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar2;
    (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
      }
    }
    (this->lockSTable).flag.super___atomic_flag_base._M_i = false;
    do {
      LOCK();
      _Var1 = (this->threadIds).lockValues.flag.super___atomic_flag_base._M_i;
      (this->threadIds).lockValues.flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var1 != false);
    for (p_Var5 = (this->threadIds).values._M_h._M_before_begin._M_nxt;
        p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
      LOCK();
      *(undefined1 *)&p_Var5[2]._M_nxt[7]._M_nxt = 1;
      UNLOCK();
    }
    (this->threadIds).lockValues.flag.super___atomic_flag_base._M_i = false;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RuntimeImp::distributeStringTable(unsigned oldVersion) {
	if (oldVersion != UINT_MAX && oldVersion == primarySTable->getVersion())
		return false;

	primarySTable->clearDirty();
	{
		std::lock_guard<SpinLock> lock0(lockSTable);
		distributedSTable = primarySTable->copy();
	}
	threadIds.forEach([&](Thread& thread) {
		thread.hasNewSTable = true;
	});

	return true;
}